

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O1

int __thiscall
soul::Optimisations::Inliner::clone
          (Inliner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Module *pMVar1;
  Block *pBVar2;
  mapped_type *pmVar3;
  PoolItem *pPVar4;
  
  pMVar1 = this->module;
  pmVar3 = std::__detail::
           _Map_base<soul::pool_ref<soul::heart::Block>,_std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Block>_>,_std::hash<soul::pool_ref<soul::heart::Block>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<soul::pool_ref<soul::heart::Block>,_std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Block>_>,_std::hash<soul::pool_ref<soul::heart::Block>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->remappedBlocks,(key_type *)(__fn + 0x18));
  pBVar2 = pmVar3->object;
  if (pBVar2 != (Block *)0x0) {
    pPVar4 = PoolAllocator::allocateSpaceForObject(&pMVar1->allocator->pool,0x58);
    *(undefined8 *)&pPVar4->field_0x18 = 0;
    pPVar4[1].size = 0;
    pPVar4->item = &PTR__Branch_002d9ee0;
    pPVar4[1].destructor = (DestructorFn *)pBVar2;
    pPVar4[1].item = &pPVar4[2].destructor;
    *(undefined8 *)&pPVar4[1].field_0x18 = 0;
    pPVar4[2].size = 4;
    pPVar4->destructor =
         PoolAllocator::allocate<soul::heart::Branch,_soul::heart::Block_&>::anon_class_1_0_00000001
         ::__invoke;
    return (int)pPVar4 + 0x10;
  }
  throwInternalCompilerError("object != nullptr","operator*",0x3b);
}

Assistant:

heart::Branch& clone (const heart::Branch& old)
        {
            return module.allocate<heart::Branch> (*remappedBlocks[old.target]);
        }